

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::execute
          (DoubletonEquationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *param_4,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *r,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             *cStatus,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *rStatus,bool isOptimal)

{
  type_conflict5 tVar1;
  bool bVar2;
  int iVar3;
  VarStatus *pVVar4;
  char *pcVar5;
  int __c;
  int __c_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_R9;
  byte in_stack_00000010;
  int _k;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aik;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  undefined4 in_stack_fffffffffffff608;
  ushort in_stack_fffffffffffff60c;
  undefined1 in_stack_fffffffffffff60e;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffff60f;
  undefined1 uVar7;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff610;
  cpp_dec_float<200U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff618;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff62c;
  uint uVar8;
  undefined2 in_stack_fffffffffffff630;
  byte in_stack_fffffffffffff632;
  byte in_stack_fffffffffffff633;
  byte in_stack_fffffffffffff634;
  byte in_stack_fffffffffffff635;
  byte in_stack_fffffffffffff636;
  byte in_stack_fffffffffffff637;
  byte local_9bd;
  undefined1 local_9bc [76];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff690;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff698;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff6a0;
  undefined1 local_93c [68];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff708;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff710;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff718;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff720;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff728;
  undefined1 local_8bc [128];
  undefined1 local_83c [128];
  undefined1 local_7bc [128];
  undefined1 local_73c [128];
  undefined4 local_6bc;
  undefined1 local_6b8 [128];
  undefined1 local_638 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  undefined1 local_4b8 [128];
  undefined8 local_438;
  undefined1 local_430 [128];
  undefined1 local_3b0 [128];
  uint local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_32c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2ac;
  undefined4 local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  byte local_219;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  undefined8 local_1e8;
  undefined4 *local_1e0;
  undefined1 *local_1d8;
  long *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined1 *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined1 *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  undefined1 *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  undefined4 *local_160;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_151;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_111;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_d1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_91;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  cpp_dec_float<200U,_int,_void> *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  cpp_dec_float<200U,_int,_void> *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  cpp_dec_float<200U,_int,_void> *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  cpp_dec_float<200U,_int,_void> *local_10;
  undefined1 *local_8;
  
  local_219 = in_stack_00000010 & 1;
  local_218 = in_R9;
  local_200 = in_RDX;
  pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
           ::operator[](in_R9,*(int *)((long)in_RDI + 0x2c));
  local_9bd = 0;
  if (((*pVVar4 != BASIC) &&
      ((pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](local_218,*(int *)((long)in_RDI + 0x2c)), *pVVar4 != ON_LOWER ||
       (local_9bd = 1, in_stack_fffffffffffff637 = local_9bd, (*(byte *)(in_RDI + 0x37) & 1) == 0)))
      ) && ((pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                      ::operator[](local_218,*(int *)((long)in_RDI + 0x2c)), *pVVar4 != ON_UPPER ||
            (local_9bd = 1, in_stack_fffffffffffff637 = local_9bd,
            (*(byte *)((long)in_RDI + 0x1b9) & 1) == 0)))) {
    pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_218,*(int *)((long)in_RDI + 0x2c));
    local_9bd = 0;
    in_stack_fffffffffffff636 = local_9bd;
    in_stack_fffffffffffff637 = local_9bd;
    if (*pVVar4 == FIXED) {
      if ((*(byte *)((long)in_RDI + 0x34) & 1) != 0) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffff610,
                     CONCAT13(in_stack_fffffffffffff60f,
                              CONCAT12(in_stack_fffffffffffff60e,in_stack_fffffffffffff60c)));
        local_220 = 0;
        tVar1 = boost::multiprecision::operator>
                          (in_stack_fffffffffffff618,(int *)in_stack_fffffffffffff610);
        if ((tVar1) &&
           (local_9bd = 1, in_stack_fffffffffffff635 = local_9bd,
           in_stack_fffffffffffff636 = local_9bd, in_stack_fffffffffffff637 = local_9bd,
           (*(byte *)((long)in_RDI + 0x1b9) & 1) != 0)) goto LAB_00739ee1;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffff610,
                     CONCAT13(in_stack_fffffffffffff60f,
                              CONCAT12(in_stack_fffffffffffff60e,in_stack_fffffffffffff60c)));
        local_224 = 0;
        tVar1 = boost::multiprecision::operator<
                          (in_stack_fffffffffffff618,(int *)in_stack_fffffffffffff610);
        if ((tVar1) &&
           (local_9bd = 1, in_stack_fffffffffffff635 = local_9bd,
           in_stack_fffffffffffff636 = local_9bd, in_stack_fffffffffffff637 = local_9bd,
           (*(byte *)(in_RDI + 0x37) & 1) != 0)) goto LAB_00739ee1;
      }
      local_9bd = 0;
      in_stack_fffffffffffff634 = local_9bd;
      in_stack_fffffffffffff635 = local_9bd;
      in_stack_fffffffffffff636 = local_9bd;
      in_stack_fffffffffffff637 = local_9bd;
      if ((*(byte *)((long)in_RDI + 0x34) & 1) == 0) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffff610,
                     CONCAT13(in_stack_fffffffffffff60f,
                              CONCAT12(in_stack_fffffffffffff60e,in_stack_fffffffffffff60c)));
        local_228 = 0;
        tVar1 = boost::multiprecision::operator>
                          (in_stack_fffffffffffff618,(int *)in_stack_fffffffffffff610);
        if ((!tVar1) ||
           (local_9bd = 1, in_stack_fffffffffffff633 = local_9bd,
           in_stack_fffffffffffff634 = local_9bd, in_stack_fffffffffffff635 = local_9bd,
           in_stack_fffffffffffff636 = local_9bd, in_stack_fffffffffffff637 = local_9bd,
           (*(byte *)(in_RDI + 0x37) & 1) == 0)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffff610,
                       CONCAT13(in_stack_fffffffffffff60f,
                                CONCAT12(in_stack_fffffffffffff60e,in_stack_fffffffffffff60c)));
          local_22c = 0;
          tVar1 = boost::multiprecision::operator<
                            (in_stack_fffffffffffff618,(int *)in_stack_fffffffffffff610);
          in_stack_fffffffffffff632 = 0;
          in_stack_fffffffffffff633 = in_stack_fffffffffffff632;
          in_stack_fffffffffffff634 = in_stack_fffffffffffff632;
          in_stack_fffffffffffff635 = in_stack_fffffffffffff632;
          in_stack_fffffffffffff636 = in_stack_fffffffffffff632;
          in_stack_fffffffffffff637 = in_stack_fffffffffffff632;
          local_9bd = in_stack_fffffffffffff632;
          if (tVar1) {
            in_stack_fffffffffffff632 = *(byte *)((long)in_RDI + 0x1b9);
            in_stack_fffffffffffff633 = in_stack_fffffffffffff632;
            in_stack_fffffffffffff634 = in_stack_fffffffffffff632;
            in_stack_fffffffffffff635 = in_stack_fffffffffffff632;
            in_stack_fffffffffffff636 = in_stack_fffffffffffff632;
            in_stack_fffffffffffff637 = in_stack_fffffffffffff632;
            local_9bd = in_stack_fffffffffffff632;
          }
        }
      }
    }
  }
LAB_00739ee1:
  if ((local_9bd & 1) != 0) {
    local_1d0 = in_RDI + 0x17;
    local_1c8 = &local_2ac;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff610,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff60f,
                        CONCAT16(in_stack_fffffffffffff60e,
                                 CONCAT24(in_stack_fffffffffffff60c,in_stack_fffffffffffff608))));
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),
                 (int)((ulong)in_stack_fffffffffffff620 >> 0x20));
    local_330 = 0;
    while (uVar8 = local_330,
          iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)(in_RDI + 0xb9)), (int)uVar8 < iVar3) {
      pcVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(in_RDI + 0xb9),(char *)(ulong)local_330,__c);
      if ((int)pcVar5 != (int)in_RDI[6]) {
        in_stack_fffffffffffff620 =
             &SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)(in_RDI + 0xb9),local_330)->m_backend;
        in_stack_fffffffffffff618 = local_200;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(in_RDI + 0xb9),(char *)(ulong)local_330,__c_00);
        local_90 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff610,
                                CONCAT13(in_stack_fffffffffffff60f,
                                         CONCAT12(in_stack_fffffffffffff60e,
                                                  in_stack_fffffffffffff60c)));
        local_80 = local_3b0;
        local_88 = in_stack_fffffffffffff620;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_91,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffff620,local_90);
        local_78 = local_3b0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff610);
        local_60 = local_3b0;
        local_68 = local_88;
        local_70 = local_90;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_stack_fffffffffffff610,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff60f,
                            CONCAT16(in_stack_fffffffffffff60e,
                                     CONCAT24(in_stack_fffffffffffff60c,in_stack_fffffffffffff608)))
                   ,(cpp_dec_float<200U,_int,_void> *)0x73a0ae);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_fffffffffffff637,
                                 CONCAT16(in_stack_fffffffffffff636,
                                          CONCAT15(in_stack_fffffffffffff635,
                                                   CONCAT14(in_stack_fffffffffffff634,
                                                            CONCAT13(in_stack_fffffffffffff633,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff632,
                                                  in_stack_fffffffffffff630)))))),
                     (self_type *)CONCAT44(uVar8,in_stack_fffffffffffff628));
      }
      local_330 = local_330 + 1;
    }
    local_100 = local_430;
    local_108 = &local_2ac;
    local_110 = &local_32c;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_111,local_108,local_110);
    local_f8 = local_430;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff610);
    local_e0 = local_430;
    local_e8 = local_108;
    local_f0 = local_110;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_stack_fffffffffffff610,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff60f,
                        CONCAT16(in_stack_fffffffffffff60e,
                                 CONCAT24(in_stack_fffffffffffff60c,in_stack_fffffffffffff608))),
               (cpp_dec_float<200U,_int,_void> *)0x73a192);
    local_168 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff610,
                             CONCAT13(in_stack_fffffffffffff60f,
                                      CONCAT12(in_stack_fffffffffffff60e,in_stack_fffffffffffff60c))
                            );
    local_170 = local_430;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff610,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff60f,
                        CONCAT16(in_stack_fffffffffffff60e,
                                 CONCAT24(in_stack_fffffffffffff60c,in_stack_fffffffffffff608))));
    local_438 = 0;
    local_50 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffff610,
                            CONCAT13(in_stack_fffffffffffff60f,
                                     CONCAT12(in_stack_fffffffffffff60e,in_stack_fffffffffffff60c)))
    ;
    local_58 = &local_438;
    local_48 = local_58;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_fffffffffffff728,(double)in_stack_fffffffffffff720);
    this_00 = (cpp_dec_float<200U,_int,_void> *)(in_RDI + 7);
    local_d0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(in_RDI + 0x27);
    local_c0 = &local_5b8;
    local_c8 = &local_2ac;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_d1,local_c8,local_d0);
    local_b8 = &local_5b8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
    local_a0 = &local_5b8;
    local_a8 = local_c8;
    local_b0 = local_d0;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (this_00,(cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff60f,
                                CONCAT16(in_stack_fffffffffffff60e,
                                         CONCAT24(in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608))),
               (cpp_dec_float<200U,_int,_void> *)0x73a2fc);
    local_140 = &local_538;
    local_148 = &local_5b8;
    local_150 = &local_32c;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_151,local_148,local_150);
    local_138 = &local_538;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
    local_120 = &local_538;
    local_128 = local_148;
    local_130 = local_150;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (this_00,(cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff60f,
                                CONCAT16(in_stack_fffffffffffff60e,
                                         CONCAT24(in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608))),
               (cpp_dec_float<200U,_int,_void> *)0x73a3b3);
    local_28 = local_4b8;
    local_38 = &local_538;
    local_30 = this_00;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)this_00,local_38);
    local_20 = local_4b8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
    local_8 = local_4b8;
    local_10 = local_30;
    local_18 = local_38;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (this_00,(cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff60f,
                                CONCAT16(in_stack_fffffffffffff60e,
                                         CONCAT24(in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608))),
               (cpp_dec_float<200U,_int,_void> *)0x73a467);
    local_178 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)this_00,
                             CONCAT13(in_stack_fffffffffffff60f,
                                      CONCAT12(in_stack_fffffffffffff60e,in_stack_fffffffffffff60c))
                            );
    local_180 = local_4b8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (this_00,(cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff60f,
                                CONCAT16(in_stack_fffffffffffff60e,
                                         CONCAT24(in_stack_fffffffffffff60c,
                                                  in_stack_fffffffffffff608))));
    if ((*(byte *)((long)in_RDI + 0x35) & 1) == 0) {
      local_1c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)this_00,
                               CONCAT13(in_stack_fffffffffffff60f,
                                        CONCAT12(in_stack_fffffffffffff60e,in_stack_fffffffffffff60c
                                                )));
      local_1b8 = local_638;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (this_00,(cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff60f,
                                  CONCAT16(in_stack_fffffffffffff60e,
                                           CONCAT24(in_stack_fffffffffffff60c,
                                                    in_stack_fffffffffffff608))));
      local_6bc = 0;
      local_1d8 = local_6b8;
      local_1e0 = &local_6bc;
      local_1e8 = 0;
      local_160 = local_1e0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffffff620,(longlong)in_stack_fffffffffffff618,this_00);
      (**(code **)(*in_RDI + 0x38))(local_73c);
      bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                         in_stack_fffffffffffff690);
      uVar7 = true;
      uVar6 = uVar7;
      if (!bVar2) {
        local_1b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)this_00,
                                 CONCAT13(1,CONCAT12(in_stack_fffffffffffff60e,
                                                     in_stack_fffffffffffff60c)));
        local_1a8 = local_7bc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (this_00,(cpp_dec_float<200U,_int,_void> *)
                           CONCAT17(uVar7,CONCAT16(in_stack_fffffffffffff60e,
                                                   CONCAT24(in_stack_fffffffffffff60c,
                                                            in_stack_fffffffffffff608))));
        (**(code **)(*in_RDI + 0x38))(local_83c);
        bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_fffffffffffff710,in_stack_fffffffffffff708);
        uVar6 = false;
        if (bVar2) {
          local_1a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)this_00,CONCAT13(uVar7,(uint3)in_stack_fffffffffffff60c));
          local_198 = local_8bc;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    (this_00,(cpp_dec_float<200U,_int,_void> *)
                             CONCAT17(uVar7,CONCAT16(uVar6,CONCAT24(in_stack_fffffffffffff60c,
                                                                    in_stack_fffffffffffff608))));
          local_190 = (long)in_RDI + 0x3bc;
          local_188 = local_93c;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    (this_00,(cpp_dec_float<200U,_int,_void> *)
                             CONCAT17(uVar7,CONCAT16(uVar6,CONCAT24(in_stack_fffffffffffff60c,
                                                                    in_stack_fffffffffffff608))));
          (**(code **)(*in_RDI + 0x38))(local_9bc);
          uVar6 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                             in_stack_fffffffffffff710);
        }
      }
      if ((bool)uVar6 == false) {
        pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](local_218,(int)in_RDI[5]);
        *pVVar4 = ON_UPPER;
      }
      else {
        pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](local_218,(int)in_RDI[5]);
        *pVVar4 = ON_LOWER;
      }
    }
    else {
      pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](local_218,(int)in_RDI[5]);
      *pVVar4 = FIXED;
    }
    pVVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_218,*(int *)((long)in_RDI + 0x2c));
    *pVVar4 = BASIC;
  }
  return;
}

Assistant:

void SPxMainSM<R>::DoubletonEquationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // dual:
   if((cStatus[m_k]  != SPxSolverBase<R>::BASIC) &&
         ((cStatus[m_k] == SPxSolverBase<R>::ON_LOWER && m_strictLo) ||
          (cStatus[m_k] == SPxSolverBase<R>::ON_UPPER && m_strictUp) ||
          (cStatus[m_k] == SPxSolverBase<R>::FIXED    &&
           ((m_maxSense && ((r[m_j] > 0 && m_strictUp) || (r[m_j] < 0 && m_strictLo))) ||
            (!m_maxSense && ((r[m_j] > 0 && m_strictLo) || (r[m_j] < 0 && m_strictUp)))))))
   {
      R val  = m_kObj;
      R aik  = m_col[m_i];

      for(int _k = 0; _k < m_col.size(); ++_k)
      {
         if(m_col.index(_k) != m_i)
            val -= m_col.value(_k) * y[m_col.index(_k)];
      }

      y[m_i] = val / aik;
      r[m_k] = 0.0;

      r[m_j] = m_jObj - val * m_aij / aik;

      SOPLEX_ASSERT_WARN("WMAISM73", isNotZero(m_aij * aik, this->epsilon()));

      // basis:
      if(m_jFixed)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else
      {
         if(GT(r[m_j], (R) 0, this->epsilon()) || (isZero(r[m_j], this->epsilon())
               && EQ(x[m_j], m_Lo_j, this->epsilon())))
            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
         else
            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }

      cStatus[m_k] = SPxSolverBase<R>::BASIC;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM23 Dimension doesn't match after this step.");
   }

#endif
}